

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslellipticcurve.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QSslEllipticCurve curve)

{
  QDebug *pQVar1;
  QString *t;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  undefined7 in_stack_ffffffffffffff88;
  char in_stack_ffffffffffffff8f;
  Stream *this;
  QDebug local_30;
  char *in_stack_ffffffffffffffd8;
  undefined8 local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18[0] = 0xaaaaaaaaaaaaaaaa;
  this = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)local_18,in_RSI);
  pQVar1 = (QDebug *)QDebug::resetFormat();
  QDebug::nospace(pQVar1);
  t = (QString *)QDebug::operator<<((QDebug *)this,in_stack_ffffffffffffffd8);
  pQVar1 = &local_30;
  QSslEllipticCurve::shortName((QSslEllipticCurve *)this);
  QDebug::operator<<(pQVar1,t);
  QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff8f);
  QString::~QString((QString *)0x396676);
  QDebug::QDebug((QDebug *)in_RDI,
                 (QDebug *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, QSslEllipticCurve curve)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace();
    debug << "QSslEllipticCurve(" << curve.shortName() << ')';
    return debug;
}